

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

void __thiscall
Scene::render_pass(Scene *this,RenderPass pass,Shadow shadow,bool light_projection,int display_w,
                  int display_h,ResourcePack *resource_pack,Camera *camera)

{
  GLuint GVar1;
  GLint GVar2;
  Mesh *pMVar3;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 *paVar4;
  string *name;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  mat4 depth_bias_mvp;
  string depthmap_shader;
  string box_mesh;
  string blue_shader;
  string shadowpcf_shader;
  string shadow_shader;
  mat4 mvp;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  float local_1d8;
  float fStack_1d4;
  undefined8 uStack_1d0;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 uStack_180;
  undefined8 uStack_170;
  undefined8 uStack_160;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  undefined8 uStack_b0;
  undefined8 uStack_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float local_60;
  float fStack_5c;
  float fStack_58;
  float fStack_54;
  float local_50;
  float fStack_4c;
  float fStack_48;
  float fStack_44;
  float local_40;
  float fStack_3c;
  float fStack_38;
  float fStack_34;
  
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"shadow","");
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"shadowpcf","");
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"blue","");
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"box","");
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"depthmap","");
  if (pass == GenerateDepthMap) {
    glViewport(0,0,this->shadow_width,this->shadow_height);
    (*__glewBindFramebuffer)(0x8d40,this->depth_map_framebuffer);
    glClear(0x100);
    glCullFace(0x404);
  }
  else if (pass == Display) {
    glViewport(0,0,display_w,display_h);
    glClear(0x4100);
  }
  fVar6 = (float)display_w / (float)display_h;
  paVar4 = &local_218;
  Camera::get_projection((mat4 *)paVar4,camera,fVar6);
  Camera::get_view((mat4 *)&local_1c8,camera);
  uStack_b0 = 0;
  uStack_1d0 = 0;
  local_98 = fStack_214;
  fStack_94 = fStack_214;
  fStack_90 = fStack_214;
  fStack_8c = fStack_214;
  uStack_a0 = 0;
  local_88 = fStack_20c;
  fStack_84 = fStack_20c;
  fStack_80 = fStack_20c;
  fStack_7c = fStack_20c;
  uStack_160 = 0;
  uStack_170 = 0;
  uStack_180 = 0;
  fVar8 = (float)local_1e8;
  fVar13 = (float)((ulong)local_1e8 >> 0x20);
  local_70 = fVar8 * fStack_1bc +
             local_1f8 * fStack_1c0 + local_208 * fStack_1c4 + local_218.x * local_1c8.x;
  fStack_6c = fVar13 * fStack_1bc +
              fStack_1f4 * fStack_1c0 + fStack_204 * fStack_1c4 + fStack_214 * local_1c8.x;
  fVar7 = (float)uStack_1e0;
  fVar11 = (float)((ulong)uStack_1e0 >> 0x20);
  fStack_68 = fVar7 * fStack_1bc +
              fStack_1f0 * fStack_1c0 + fStack_200 * fStack_1c4 + fStack_210 * local_1c8.x;
  fStack_64 = fStack_1bc * fVar11 +
              fStack_1c0 * fStack_1ec + fStack_1c4 * fStack_1fc + local_1c8.x * fStack_20c;
  local_60 = fVar8 * uStack_1b0._4_4_ +
             local_1f8 * (float)uStack_1b0 +
             local_208 * local_1b8._4_4_ + local_218.x * (float)local_1b8;
  fStack_5c = fVar13 * uStack_1b0._4_4_ +
              fStack_1f4 * (float)uStack_1b0 +
              fStack_204 * local_1b8._4_4_ + fStack_214 * (float)local_1b8;
  fStack_58 = fVar7 * uStack_1b0._4_4_ +
              fStack_1f0 * (float)uStack_1b0 +
              fStack_200 * local_1b8._4_4_ + fStack_210 * (float)local_1b8;
  fStack_54 = uStack_1b0._4_4_ * fVar11 +
              (float)uStack_1b0 * fStack_1ec +
              local_1b8._4_4_ * fStack_1fc + (float)local_1b8 * fStack_20c;
  local_50 = fVar8 * uStack_1a0._4_4_ +
             local_1f8 * (float)uStack_1a0 +
             local_208 * local_1a8._4_4_ + local_218.x * (float)local_1a8;
  fStack_4c = fVar13 * uStack_1a0._4_4_ +
              fStack_1f4 * (float)uStack_1a0 +
              fStack_204 * local_1a8._4_4_ + fStack_214 * (float)local_1a8;
  fStack_48 = fVar7 * uStack_1a0._4_4_ +
              fStack_1f0 * (float)uStack_1a0 +
              fStack_200 * local_1a8._4_4_ + fStack_210 * (float)local_1a8;
  fStack_44 = uStack_1a0._4_4_ * fVar11 +
              (float)uStack_1a0 * fStack_1ec +
              local_1a8._4_4_ * fStack_1fc + (float)local_1a8 * fStack_20c;
  local_40 = fVar8 * uStack_190._4_4_ +
             local_1f8 * (float)uStack_190 +
             local_208 * local_198._4_4_ + local_218.x * (float)local_198;
  fStack_3c = fVar13 * uStack_190._4_4_ +
              fStack_1f4 * (float)uStack_190 +
              fStack_204 * local_198._4_4_ + fStack_214 * (float)local_198;
  fStack_38 = fVar7 * uStack_190._4_4_ +
              fStack_1f0 * (float)uStack_190 +
              fStack_200 * local_198._4_4_ + fStack_210 * (float)local_198;
  fStack_34 = fVar11 * uStack_190._4_4_ +
              fStack_1ec * (float)uStack_190 +
              fStack_1fc * local_198._4_4_ + fStack_20c * (float)local_198;
  if (light_projection) {
    fVar7 = -0.33333334;
    fVar11 = 1.0;
    fVar8 = -0.0;
    fVar13 = -0.0;
    fVar9 = -0.06666667;
    fVar10 = 0.0;
    fVar12 = 0.05;
    fVar6 = 0.05;
  }
  else {
    fVar8 = fVar6 + -1.1920929e-07;
    uVar5 = -(uint)(-fVar8 <= fVar8);
    if ((float)(~uVar5 & (uint)-fVar8 | (uint)fVar8 & uVar5) <= 0.0) {
      __assert_fail("abs(aspect - std::numeric_limits<T>::epsilon()) > static_cast<T>(0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/glm/glm/gtc/../ext/matrix_clip_space.inl"
                    ,0xfb,"mat<4, 4, T, defaultp> glm::perspectiveRH_NO(T, T, T, T) [T = float]");
    }
    fVar6 = 1.0 / (fVar6 * 0.003927011);
    fVar8 = 0.0;
    fVar13 = 0.0;
    fVar7 = 13.333333;
    fVar11 = 0.0;
    fVar9 = -0.33333334;
    fVar10 = -1.0;
    fVar12 = 254.64659;
  }
  fStack_20c = 0.0 - fVar10 * 0.43643576;
  _local_1d8 = CONCAT44(fVar13,fVar8);
  uStack_1d0 = 0;
  local_218.x = (0.0 - fVar6 * 0.44721356) + fVar8;
  fStack_214 = (fVar12 * 0.78071994 - 0.0) + fVar13;
  fStack_1f0 = (float)((uint)fVar7 & 0x80000000);
  fStack_210 = (0.0 - fVar9 * 0.43643576) + fStack_1f0;
  local_208 = fVar6 * 0.0 + 0.0 + 0.0 + fVar8;
  fStack_204 = fVar12 * 0.48794997 + 0.0 + fVar13;
  fStack_1fc = fVar10 * 0.8728715 + 0.0;
  fStack_200 = fVar9 * 0.8728715 + 0.0 + fStack_1f0;
  fStack_1ec = 0.0 - fVar10 * 0.21821788;
  local_1f8 = fVar6 * 0.8944271 + 0.0 + fVar8;
  fStack_1f4 = fVar12 * 0.39035997 + 0.0 + fVar13;
  fStack_1f0 = (0.0 - fVar9 * 0.21821788) + fStack_1f0;
  fVar8 = (fVar6 * -0.0 - 0.0) + fVar8;
  fVar13 = fVar13 - fVar12 * 2.9802322e-08;
  local_1e8 = CONCAT44(fVar13,fVar8);
  fVar7 = fVar7 - fVar9 * 4.5825753;
  fVar11 = fVar11 - fVar10 * 4.5825753;
  uStack_1e0 = CONCAT44(fVar11,fVar7);
  fVar9 = fStack_214 * 0.0 + local_218.x * 0.0;
  fVar6 = fStack_210 * 0.0;
  fStack_1bc = fVar6 + fVar9 + fStack_20c;
  fStack_1c0 = fStack_20c * 0.5;
  local_1c8.x = local_218.x * 0.5 + fStack_214 * 0.0 + fVar6 + fStack_1c0;
  fStack_1c4 = fStack_214 * 0.5 + local_218.x * 0.0 + fVar6 + fStack_1c0;
  fStack_1c0 = fStack_1c0 + fStack_210 * 0.5 + fVar9;
  fVar9 = fStack_204 * 0.0 + local_208 * 0.0;
  fVar6 = fStack_200 * 0.0;
  fVar10 = fStack_1fc * 0.5;
  local_1b8 = CONCAT44(fStack_204 * 0.5 + local_208 * 0.0 + fVar6 + fVar10,
                       local_208 * 0.5 + fStack_204 * 0.0 + fVar6 + fVar10);
  uStack_1b0 = CONCAT44(fVar6 + fVar9 + fStack_1fc,fVar10 + fStack_200 * 0.5 + fVar9);
  fVar9 = fStack_1f4 * 0.0 + local_1f8 * 0.0;
  fVar6 = fStack_1f0 * 0.0;
  fVar10 = fStack_1ec * 0.5;
  local_1a8 = CONCAT44(fStack_1f4 * 0.5 + local_1f8 * 0.0 + fVar6 + fVar10,
                       local_1f8 * 0.5 + fStack_1f4 * 0.0 + fVar6 + fVar10);
  uStack_1a0 = CONCAT44(fVar6 + fVar9 + fStack_1ec,fVar10 + fStack_1f0 * 0.5 + fVar9);
  fVar10 = fVar13 * 0.0 + fVar8 * 0.0;
  fVar6 = fVar7 * 0.0;
  fVar9 = fVar11 * 0.5;
  local_198 = CONCAT44(fVar13 * 0.5 + fVar8 * 0.0 + fVar6 + fVar9,
                       fVar8 * 0.5 + fVar13 * 0.0 + fVar6 + fVar9);
  uStack_190 = CONCAT44(fVar6 + fVar10 + fVar11,fVar9 + fVar7 * 0.5 + fVar10);
  (*__glewEnableVertexAttribArray)(0);
  (*__glewBindBuffer)(0x8892,this->grid_vertex_buffer);
  (*__glewVertexAttribPointer)(0,3,0x1406,'\0',0,(void *)0x0);
  if (pass == Display) {
    glBindTexture(0xde1,this->depth_map);
    name = &local_d8;
    if (shadow != ShadowMapping) {
      if (shadow != ShadowMappingPCF) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"UNIMPLEMENTED",0xd);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        exit(1);
      }
      name = &local_f8;
    }
    GVar1 = ResourcePack::get_program(resource_pack,name);
    (*__glewUseProgram)(GVar1);
    GVar2 = (*__glewGetUniformLocation)(GVar1,"mvp");
    (*__glewUniformMatrix4fv)(GVar2,1,'\0',&local_70);
    GVar2 = (*__glewGetUniformLocation)(GVar1,"depth_bias_mvp");
    paVar4 = &local_1c8;
LAB_001bfec1:
    (*__glewUniformMatrix4fv)(GVar2,1,'\0',&paVar4->x);
  }
  else if (pass == GenerateDepthMap) {
    GVar1 = ResourcePack::get_program(resource_pack,&local_158);
    (*__glewUseProgram)(GVar1);
    GVar2 = (*__glewGetUniformLocation)(GVar1,"depth_mvp");
    goto LAB_001bfec1;
  }
  (*__glewBindBuffer)(0x8893,this->grid_index_buffer);
  glDrawElements(4,(ulong)((long)(this->grid_indices).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->grid_indices).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2,0x1405,0);
  (*__glewDisableVertexAttribArray)(0);
  (*__glewEnableVertexAttribArray)(0);
  (*__glewBindBuffer)(0x8892,this->object_vertex_buffer);
  (*__glewVertexAttribPointer)(0,3,0x1406,'\0',0,(void *)0x0);
  if (pass == Display) {
    (*__glewEnableVertexAttribArray)(1);
    (*__glewBindBuffer)(0x8892,this->object_normal_buffer);
    (*__glewVertexAttribPointer)(1,3,0x1406,'\0',0,(void *)0x0);
    glBindTexture(0xde1,this->depth_map);
    GVar1 = ResourcePack::get_program(resource_pack,&local_118);
    (*__glewUseProgram)(GVar1);
    GVar2 = (*__glewGetUniformLocation)(GVar1,"mvp");
    (*__glewUniformMatrix4fv)(GVar2,1,'\0',&local_70);
    GVar2 = (*__glewGetUniformLocation)(GVar1,"depth_bias_mvp");
    paVar4 = &local_1c8;
  }
  else {
    if (pass != GenerateDepthMap) goto LAB_001c0048;
    GVar1 = ResourcePack::get_program(resource_pack,&local_158);
    (*__glewUseProgram)(GVar1);
    GVar2 = (*__glewGetUniformLocation)(GVar1,"depth_mvp");
    paVar4 = &local_218;
  }
  (*__glewUniformMatrix4fv)(GVar2,1,'\0',&paVar4->x);
LAB_001c0048:
  pMVar3 = ResourcePack::get_mesh(resource_pack,&local_138);
  glDrawArrays(4,0,(ulong)((long)(pMVar3->vertices).
                                 super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(pMVar3->vertices).super__Vector_base<float,_std::allocator<float>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 2);
  (*__glewDisableVertexAttribArray)(0);
  if (pass == Display) {
    (*__glewDisableVertexAttribArray)(1);
  }
  if (pass == GenerateDepthMap) {
    (*__glewBindFramebuffer)(0x8d40,0);
    glCullFace(0x405);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Scene::render_pass(RenderPass pass, Shadow shadow, bool light_projection, int display_w, int display_h, ResourcePack& resource_pack, Camera& camera) {
    std::string shadow_shader("shadow");
    std::string shadowpcf_shader("shadowpcf");
    std::string blue_shader("blue");
    std::string box_mesh("box");
    std::string depthmap_shader("depthmap");
    GLuint uniform = -1;
    GLuint program_id = -1;

    switch (pass) {
        case RenderPass::GenerateDepthMap:
            glViewport(0, 0, shadow_width, shadow_height);
            glBindFramebuffer(GL_FRAMEBUFFER, depth_map_framebuffer);
            glClear(GL_DEPTH_BUFFER_BIT);
            glCullFace(GL_FRONT);
            break;
        case RenderPass::Display:
            glViewport(0, 0, display_w, display_h);
            glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
            break;
    }

    glm::mat4 mvp = camera.get_projection(static_cast<float>(display_w)/display_h) * camera.get_view();
    float near_plane = -10.0f, far_plane = 20.0f;
    glm::mat4 lightView = glm::lookAt(
        glm::vec3(-2.0f, 4.0f, -1.0f),
        glm::vec3(0.0f, 0.0f,  0.0f),
        glm::vec3(0.0f, 1.0f,  0.0f)
    );
    glm::mat4 lightProjection;
    if (light_projection) {
        lightProjection = glm::ortho(-20.0f, 20.0f, -20.0f, 20.0f, near_plane, far_plane);
    }
    else {
        lightProjection = glm::perspective(
            (float)glm::radians(0.45),
            static_cast<float>(display_w)/display_h,
            near_plane,
            far_plane
        );
    }
    glm::mat4 bias(
        0.5, 0.0, 0.0, 0.0,
        0.0, 0.5, 0.0, 0.0,
        0.0, 0.0, 0.5, 0.0,
        0.5, 0.5, 0.5, 1.0
    );
    glm::mat4 depth_mvp = lightProjection * lightView;
    glm::mat4 depth_bias_mvp = bias * depth_mvp;

    // Draw ground
    glEnableVertexAttribArray(0);
    glBindBuffer(GL_ARRAY_BUFFER, grid_vertex_buffer);
    glVertexAttribPointer(
        0,
        3,
        GL_FLOAT,
        GL_FALSE,
        0,
        (void*)0
    );

    if (pass == RenderPass::Display) {
        glBindTexture(GL_TEXTURE_2D, depth_map);
    }

    switch (pass) {
        case RenderPass::GenerateDepthMap:
            program_id = resource_pack.get_program(depthmap_shader);
            glUseProgram(program_id);
            uniform = glGetUniformLocation(program_id, "depth_mvp");
            glUniformMatrix4fv(uniform, 1, GL_FALSE, &depth_mvp[0][0]);
            break;
        case RenderPass::Display:
            switch (shadow) {
                case Shadow::ShadowMapping:
                    program_id = resource_pack.get_program(shadow_shader);
                    break;
                case Shadow::ShadowMappingPCF:
                    program_id = resource_pack.get_program(shadowpcf_shader);
                    break;
                default:
                    std::cout << "UNIMPLEMENTED" << std::endl;
                    exit(1);
            }
            glUseProgram(program_id);
            uniform = glGetUniformLocation(program_id, "mvp");
            glUniformMatrix4fv(uniform, 1, GL_FALSE, &mvp[0][0]);
            uniform = glGetUniformLocation(program_id, "depth_bias_mvp");
            glUniformMatrix4fv(uniform, 1, GL_FALSE, &depth_bias_mvp[0][0]);
            break;
    }

    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, grid_index_buffer);
    glDrawElements(GL_TRIANGLES, grid_indices.size(), GL_UNSIGNED_INT, 0);

    glDisableVertexAttribArray(0);

    // Draw object
    glEnableVertexAttribArray(0);
    glBindBuffer(GL_ARRAY_BUFFER, object_vertex_buffer);
    glVertexAttribPointer(
        0,
        3,
        GL_FLOAT,
        GL_FALSE,
        0,
        (void*)0
    );

    if (pass == RenderPass::Display) {
        glEnableVertexAttribArray(1);
        glBindBuffer(GL_ARRAY_BUFFER, object_normal_buffer);
        glVertexAttribPointer(
            1,
            3,
            GL_FLOAT,
            GL_FALSE,
            0,
            (void*)0
        );
    }

    if (pass == RenderPass::Display) {
        glBindTexture(GL_TEXTURE_2D, depth_map);
    }

    switch (pass) {
        case RenderPass::GenerateDepthMap:
            program_id = resource_pack.get_program(depthmap_shader);
            glUseProgram(program_id);
            uniform = glGetUniformLocation(program_id, "depth_mvp");
            glUniformMatrix4fv(uniform, 1, GL_FALSE, &depth_mvp[0][0]);
            break;
        case RenderPass::Display:
            program_id = resource_pack.get_program(blue_shader);
            glUseProgram(program_id);
            uniform = glGetUniformLocation(program_id, "mvp");
            glUniformMatrix4fv(uniform, 1, GL_FALSE, &mvp[0][0]);
            uniform = glGetUniformLocation(program_id, "depth_bias_mvp");
            glUniformMatrix4fv(uniform, 1, GL_FALSE, &depth_bias_mvp[0][0]);
            break;
    }

    glDrawArrays(GL_TRIANGLES, 0, resource_pack.get_mesh(box_mesh)->vertices.size());

    glDisableVertexAttribArray(0);

    if (pass == RenderPass::Display) {
        glDisableVertexAttribArray(1);
    }

    switch (pass) {
        case RenderPass::GenerateDepthMap:
            glBindFramebuffer(GL_FRAMEBUFFER, 0);
            glCullFace(GL_BACK);
            break;
        case RenderPass::Display:
            break;
    }
}